

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O2

Result __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::calculate<false>
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,
          Trajectory<3UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  size_t *psVar1;
  StandardVector<Synchronization,_3UL> *pSVar2;
  double *pdVar3;
  Profile *this_00;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  DurationDiscretization DVar12;
  ControlSigns CVar13;
  ControlInterface CVar14;
  pointer paVar15;
  double dVar16;
  char cVar17;
  bool bVar18;
  array<double,_3UL> *paVar19;
  array<ruckig::ControlInterface,_3UL> *paVar20;
  ControlInterface *pCVar21;
  array<ruckig::Synchronization,_3UL> *paVar22;
  Synchronization *pSVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  size_t sVar27;
  long lVar28;
  _Storage<unsigned_long,_true> _Var29;
  Profile *pPVar30;
  byte bVar31;
  long lVar32;
  Block *pBVar33;
  long lVar34;
  bool *pbVar35;
  long lVar36;
  size_t dof_1;
  ulong uVar37;
  long lVar38;
  StandardVector<Block,_3UL> *__src;
  ulong uVar39;
  undefined8 uVar40;
  double tf;
  double dVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  optional<double> t_min;
  _Storage<unsigned_long,_true> local_e98;
  char local_e90;
  StandardVector<Block,_3UL> *local_e88;
  Synchronization *local_e80;
  double *local_e78;
  double local_e70;
  optional<std::array<ruckig::Synchronization,_3UL>_> *local_e68;
  optional<std::array<ruckig::ControlInterface,_3UL>_> *local_e60;
  optional<std::array<double,_3UL>_> *local_e58;
  optional<std::array<double,_3UL>_> *local_e50;
  PositionFirstOrderStep1 step1;
  
  *was_interrupted = false;
  lVar36 = 0;
  local_e70 = delta_time;
  Trajectory<3UL,_ruckig::StandardVector>::resize<3UL,_0>(traj,0);
  psVar1 = &this->degrees_of_freedom;
  local_e50 = &inp->min_velocity;
  local_e58 = &inp->min_acceleration;
  local_e78 = (double *)&inp->control_interface;
  local_e60 = &inp->per_dof_control_interface;
  local_e80 = &inp->synchronization;
  local_e68 = &inp->per_dof_synchronization;
  pSVar2 = &this->inp_per_dof_synchronization;
  local_e88 = &this->blocks;
  pbVar35 = &(this->blocks)._M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  lVar28 = 0;
  for (lVar38 = 0x57a; lVar38 - 0x57aU < *psVar1; lVar38 = lVar38 + 1) {
    paVar15 = (traj->profiles).
              super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((inp->min_velocity).super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
      paVar19 = std::optional<std::array<double,_3UL>_>::value(local_e50);
      uVar39 = *(ulong *)((long)paVar19->_M_elems + lVar28 * 2);
    }
    else {
      uVar39 = *(ulong *)((long)(inp->max_velocity)._M_elems + lVar28 * 2) ^ 0x8000000000000000;
    }
    *(ulong *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2) = uVar39;
    if ((inp->min_acceleration).super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload
        .super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
      paVar19 = std::optional<std::array<double,_3UL>_>::value(local_e58);
      uVar39 = *(ulong *)((long)paVar19->_M_elems + lVar28 * 2);
    }
    else {
      uVar39 = *(ulong *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2) ^ 0x8000000000000000;
    }
    *(ulong *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2) = uVar39;
    pCVar21 = (ControlInterface *)local_e78;
    if ((inp->per_dof_control_interface).
        super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged == true)
    {
      paVar20 = std::optional<std::array<ruckig::ControlInterface,_3UL>_>::value(local_e60);
      pCVar21 = (ControlInterface *)((long)paVar20->_M_elems + lVar28);
    }
    *(ControlInterface *)((long)(this->inp_per_dof_control_interface)._M_elems + lVar28) = *pCVar21;
    pSVar23 = local_e80;
    if ((inp->per_dof_synchronization).
        super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>._M_engaged == true)
    {
      paVar22 = std::optional<std::array<ruckig::Synchronization,_3UL>_>::value(local_e68);
      pSVar23 = (Synchronization *)((long)paVar22->_M_elems + lVar28);
    }
    *(Synchronization *)((long)(this->inp_per_dof_synchronization)._M_elems + lVar28) = *pSVar23;
    if (*(char *)((long)inp + lVar38 + -0x312) == '\0') {
      *(undefined8 *)((long)&paVar15->_M_elems[0].p + lVar36 + 0x38U) =
           *(undefined8 *)((long)(inp->current_position)._M_elems + lVar28 * 2);
      *(undefined8 *)((long)&paVar15->_M_elems[0].v + lVar36 + 0x38U) =
           *(undefined8 *)((long)(inp->current_velocity)._M_elems + lVar28 * 2);
      *(undefined8 *)((long)&paVar15->_M_elems[0].a + lVar36 + 0x38U) =
           *(undefined8 *)((long)(inp->current_acceleration)._M_elems + lVar28 * 2);
      *(undefined8 *)((long)&paVar15->_M_elems[0].t_sum + lVar36 + 0x30U) = 0;
      pcVar5 = pbVar35 + -0x4b0;
      pcVar5[0] = '\0';
      pcVar5[1] = '\0';
      pcVar5[2] = '\0';
      pcVar5[3] = '\0';
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      if (pbVar35[-600] == true) {
        pbVar35[-600] = false;
      }
      if (*pbVar35 == true) {
        *pbVar35 = false;
      }
    }
    else {
      iVar11 = *(int *)((long)(this->inp_per_dof_control_interface)._M_elems + lVar28);
      if (iVar11 == 1) {
        dVar41 = *(double *)((long)(inp->max_jerk)._M_elems + lVar28 * 2);
        if (ABS(dVar41) == INFINITY) {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        else {
          ruckig::BrakeProfile::get_velocity_brake_trajectory
                    (*(double *)((long)(inp->current_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2),dVar41);
        }
        uVar43 = *(undefined8 *)((long)(inp->current_position)._M_elems + lVar28 * 2);
        uVar42 = *(undefined8 *)((long)(inp->current_velocity)._M_elems + lVar28 * 2);
        uVar6 = *(undefined8 *)((long)(inp->current_acceleration)._M_elems + lVar28 * 2);
        uVar40 = *(undefined8 *)((long)(inp->target_velocity)._M_elems + lVar28 * 2);
        uVar7 = *(undefined8 *)((long)(inp->target_acceleration)._M_elems + lVar28 * 2);
        lVar24 = 0x220;
        lVar25 = 0x228;
        lVar26 = 0x128;
        lVar32 = 0xe8;
        lVar34 = 0xa8;
LAB_0010ff56:
        *(undefined8 *)((long)&paVar15->_M_elems[0].t + lVar36 + lVar34) = uVar6;
        *(undefined8 *)((long)&paVar15->_M_elems[0].t + lVar36 + lVar32) = uVar42;
        *(undefined8 *)((long)&paVar15->_M_elems[0].t + lVar36 + lVar26) = uVar43;
        *(undefined8 *)((long)&paVar15->_M_elems[0].t + lVar36 + lVar25) = uVar7;
        *(undefined8 *)((long)&paVar15->_M_elems[0].t + lVar36 + lVar24) = uVar40;
      }
      else if (iVar11 == 0) {
        dVar41 = *(double *)((long)(inp->max_jerk)._M_elems + lVar28 * 2);
        if (ABS(dVar41) == INFINITY) {
          dVar41 = *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2);
          if (ABS(dVar41) != INFINITY) {
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      (*(double *)((long)(inp->current_velocity)._M_elems + lVar28 * 2),
                       *(double *)((long)(inp->max_velocity)._M_elems + lVar28 * 2),
                       *(double *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2),dVar41,
                       *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2));
          }
        }
        else {
          ruckig::BrakeProfile::get_position_brake_trajectory
                    (*(double *)((long)(inp->current_velocity)._M_elems + lVar28 * 2),
                     *(double *)((long)(inp->current_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(inp->max_velocity)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2),
                     *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2),dVar41);
        }
        uVar42 = *(undefined8 *)((long)(inp->current_position)._M_elems + lVar28 * 2);
        uVar6 = *(undefined8 *)((long)(inp->current_velocity)._M_elems + lVar28 * 2);
        uVar40 = *(undefined8 *)((long)(inp->target_position)._M_elems + lVar28 * 2);
        uVar7 = *(undefined8 *)((long)(inp->target_velocity)._M_elems + lVar28 * 2);
        uVar43 = *(undefined8 *)((long)(inp->target_acceleration)._M_elems + lVar28 * 2);
        *(undefined8 *)((long)&paVar15->_M_elems[0].a + lVar36) =
             *(undefined8 *)((long)(inp->current_acceleration)._M_elems + lVar28 * 2);
        lVar24 = 0x218;
        lVar25 = 0x220;
        lVar26 = 0x228;
        lVar32 = 0x128;
        lVar34 = 0xe8;
        goto LAB_0010ff56;
      }
      if ((*(ulong *)((long)(inp->max_jerk)._M_elems + lVar28 * 2) & 0x7fffffffffffffff) ==
          0x7ff0000000000000) {
        if ((*(ulong *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2) & 0x7fffffffffffffff)
            != 0x7ff0000000000000) {
          BrakeProfile::finalize_second_order
                    ((BrakeProfile *)((long)&paVar15->_M_elems[0].brake + lVar36),
                     (double *)((long)&paVar15->_M_elems[0].p + lVar36),
                     (double *)((long)&paVar15->_M_elems[0].v + lVar36),
                     (double *)((long)&paVar15->_M_elems[0].a + lVar36));
        }
      }
      else {
        BrakeProfile::finalize
                  ((BrakeProfile *)((long)&paVar15->_M_elems[0].brake + lVar36),
                   (double *)((long)&paVar15->_M_elems[0].p + lVar36),
                   (double *)((long)&paVar15->_M_elems[0].v + lVar36),
                   (double *)((long)&paVar15->_M_elems[0].a + lVar36));
      }
      pBVar33 = (Block *)((long)&paVar15->_M_elems[0].t + lVar36);
      iVar11 = *(int *)((long)(this->inp_per_dof_control_interface)._M_elems + lVar28);
      if (iVar11 == 1) {
        dVar41 = *(double *)((long)(inp->max_jerk)._M_elems + lVar28 * 2);
        if (ABS(dVar41) == INFINITY) {
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)&step1,
                     *(double *)((long)&paVar15->_M_elems[0].v + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x60U),
                     *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2));
          cVar17 = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)&step1,pBVar33);
        }
        else {
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)&step1,
                     *(double *)((long)&paVar15->_M_elems[0].v + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].a + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x60U),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x68U),
                     *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2),dVar41);
          cVar17 = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)&step1,pBVar33);
        }
      }
      else {
        if (iVar11 != 0) goto LAB_00110410;
        dVar41 = *(double *)((long)(inp->max_jerk)._M_elems + lVar28 * 2);
        if (ABS(dVar41) == INFINITY) {
          dVar41 = *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2);
          if (ABS(dVar41) == INFINITY) {
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      (&step1,*(double *)((long)&paVar15->_M_elems[0].p + lVar36),
                       *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x58U),
                       *(double *)((long)(inp->max_velocity)._M_elems + lVar28 * 2),
                       *(double *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2));
            cVar17 = ruckig::PositionFirstOrderStep1::get_profile((Profile *)&step1,pBVar33);
          }
          else {
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)&step1,
                       *(double *)((long)&paVar15->_M_elems[0].p + lVar36),
                       *(double *)((long)&paVar15->_M_elems[0].v + lVar36),
                       *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x58U),
                       *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x60U),
                       *(double *)((long)(inp->max_velocity)._M_elems + lVar28 * 2),
                       *(double *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2),dVar41,
                       *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2));
            cVar17 = ruckig::PositionSecondOrderStep1::get_profile((Profile *)&step1,pBVar33);
          }
        }
        else {
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)&step1,
                     *(double *)((long)&paVar15->_M_elems[0].p + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].v + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].a + lVar36),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x58U),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x60U),
                     *(double *)((long)&paVar15->_M_elems[0].accel + lVar36 + 0x68U),
                     *(double *)((long)(inp->max_velocity)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_velocity)._M_elems + lVar28 * 2),
                     *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2),
                     *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2),dVar41);
          cVar17 = ruckig::PositionThirdOrderStep1::get_profile((Profile *)&step1,pBVar33);
        }
      }
      if (cVar17 == '\0') {
LAB_00110410:
        dVar41 = *(double *)((long)(inp->max_acceleration)._M_elems + lVar28 * 2);
        if ((((dVar41 != 0.0) || (NAN(dVar41))) &&
            ((dVar41 = *(double *)((long)(this->inp_min_acceleration)._M_elems + lVar28 * 2),
             dVar41 != 0.0 || (NAN(dVar41))))) &&
           ((dVar41 = *(double *)((long)(inp->max_jerk)._M_elems + lVar28 * 2), dVar41 != 0.0 ||
            (NAN(dVar41))))) {
          return ErrorExecutionTimeCalculation;
        }
        return ErrorZeroLimits;
      }
      *(undefined8 *)((long)(traj->independent_min_durations)._M_elems + lVar28 * 2) =
           *(undefined8 *)(pbVar35 + -0x4b0);
    }
    lVar28 = lVar28 + 4;
    pbVar35 = pbVar35 + 0x6f8;
    lVar36 = lVar36 + 0x240;
  }
  DVar12 = inp->duration_discretization;
  bVar18 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
  if ((*psVar1 == 1 && (bVar18 & 1U) == 0) && DVar12 != Discrete) {
    traj->duration = (this->blocks)._M_elems[0].t_min;
    memcpy((traj->profiles).
           super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start,local_e88,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
  }
  else {
    local_e90 = '\0';
    local_e78 = &traj->duration;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = bVar18;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = 0;
    bVar18 = synchronize(this,t_min,local_e78,(optional<unsigned_long> *)&local_e98,
                         (traj->profiles).
                         super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,DVar12 == Discrete,local_e70);
    if (!bVar18) {
      sVar27 = 0;
      do {
        if (*psVar1 == sVar27) {
          return ErrorSynchronizationCalculation;
        }
        dVar41 = (inp->max_acceleration)._M_elems[sVar27];
        if ((dVar41 == 0.0) && (!NAN(dVar41))) {
          return ErrorZeroLimits;
        }
        dVar41 = (this->inp_min_acceleration)._M_elems[sVar27];
        if ((dVar41 == 0.0) && (!NAN(dVar41))) {
          return ErrorZeroLimits;
        }
        dVar41 = (inp->max_jerk)._M_elems[sVar27];
        sVar27 = sVar27 + 1;
      } while ((dVar41 != 0.0) || (NAN(dVar41)));
      return ErrorZeroLimits;
    }
    local_e80 = (Synchronization *)CONCAT71(local_e80._1_7_,DVar12 == Discrete);
    lVar36 = 0xc4;
    lVar28 = 0;
    for (_Var29._M_value = 0; uVar39 = *psVar1, _Var29._M_value < uVar39;
        _Var29._M_value = _Var29._M_value + 1) {
      if (((inp->enabled)._M_elems[_Var29._M_value] == true) &&
         ((this->inp_per_dof_synchronization)._M_elems[_Var29._M_value] == None)) {
        pdVar3 = (double *)((long)(this->new_phase_control)._M_elems + lVar36 * 4);
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar28),
               pdVar3 + -0x48,0x23c);
        dVar41 = *pdVar3;
        if (traj->duration <= dVar41 && dVar41 != traj->duration) {
          *local_e78 = dVar41;
          local_e90 = '\x01';
          local_e98 = _Var29;
        }
      }
      lVar36 = lVar36 + 0x1be;
      lVar28 = lVar28 + 0x240;
    }
    dVar41 = traj->duration;
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = dVar41;
    if (7600.0 < dVar41) {
      return ErrorTrajectoryDuration;
    }
    if ((dVar41 == 0.0) && (!NAN(dVar41))) {
      lVar28 = 0;
      __src = local_e88;
      for (uVar37 = 0; uVar37 < uVar39; uVar37 = uVar37 + 1) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar28),
               __src,0x23c);
        uVar39 = *psVar1;
        lVar28 = lVar28 + 0x240;
        __src = (StandardVector<Block,_3UL> *)(__src->_M_elems + 1);
      }
      return Working;
    }
    if ((DVar12 == Discrete) ||
       (bVar18 = std::
                 all_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                           (pSVar2,psVar1), !bVar18)) {
      if ((local_e90 == '\x01') &&
         (bVar18 = std::
                   any_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                             (pSVar2,psVar1), _Var29 = local_e98, bVar18)) {
        if (local_e90 == '\0') {
          std::__throw_bad_optional_access();
        }
        paVar15 = (traj->profiles).
                  super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar18 = is_input_collinear(this,inp,*(Direction *)
                                              ((long)(paVar15->_M_elems + (long)local_e98) + 0x234),
                                    local_e98._M_value);
        if (bVar18) {
          pPVar30 = paVar15->_M_elems + (long)_Var29;
          bVar31 = 1;
          lVar28 = 0;
          for (uVar39 = 0; uVar39 < *psVar1; uVar39 = uVar39 + 1) {
            if (((inp->enabled)._M_elems[uVar39] == true) &&
               (((local_e90 != '\x01' || (uVar39 != local_e98._M_value)) &&
                (pSVar2->_M_elems[uVar39] == Phase)))) {
              paVar15 = (traj->profiles).
                        super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              this_00 = (Profile *)((long)&paVar15->_M_elems[0].t + lVar28);
              tf = (traj->duration - *(double *)((long)&paVar15->_M_elems[0].brake + lVar28)) -
                   *(double *)((long)&paVar15->_M_elems[0].accel + lVar28);
              dVar41 = *(double *)((long)&pPVar30->t + 8);
              dVar8 = *(double *)((long)&pPVar30->t + 0x10);
              dVar9 = *(double *)((long)&pPVar30->t + 0x18);
              dVar10 = *(double *)((long)&pPVar30->t + 0x20);
              dVar16 = *(double *)((long)&pPVar30->t + 0x28);
              puVar4 = (undefined8 *)((long)&paVar15->_M_elems[0].t + lVar28);
              *puVar4 = (pPVar30->t)._M_elems[0];
              puVar4[1] = dVar41;
              pdVar3 = (double *)((long)&paVar15->_M_elems[0].t + lVar28 + 0x10);
              *pdVar3 = dVar8;
              pdVar3[1] = dVar9;
              pdVar3 = (double *)((long)&paVar15->_M_elems[0].t + lVar28 + 0x20);
              *pdVar3 = dVar10;
              pdVar3[1] = dVar16;
              *(double *)((long)&paVar15->_M_elems[0].t + lVar28 + 0x30) =
                   *(double *)((long)&pPVar30->t + 0x30);
              CVar13 = pPVar30->control_signs;
              *(ControlSigns *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x78U) = CVar13;
              CVar14 = (this->inp_per_dof_control_interface)._M_elems[uVar39];
              if (CVar14 == Velocity) {
                if (CVar13 == UDUD) {
                  dVar41 = (inp->max_acceleration)._M_elems[uVar39];
                  dVar8 = (inp->max_jerk)._M_elems[uVar39];
                  dVar9 = (this->new_phase_control)._M_elems[uVar39];
                  dVar10 = (this->inp_min_acceleration)._M_elems[uVar39];
                  if (ABS(dVar8) == INFINITY) {
                    bVar18 = Profile::
                             check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar9,dVar41,dVar10);
                  }
                  else {
                    bVar18 = Profile::
                             check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar9,dVar41,dVar10,dVar8);
                  }
                }
                else {
                  if (CVar13 != UDDU) goto LAB_001108f5;
                  dVar41 = (inp->max_acceleration)._M_elems[uVar39];
                  dVar8 = (inp->max_jerk)._M_elems[uVar39];
                  dVar9 = (this->new_phase_control)._M_elems[uVar39];
                  dVar10 = (this->inp_min_acceleration)._M_elems[uVar39];
                  if (ABS(dVar8) == INFINITY) {
                    bVar18 = Profile::
                             check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar9,dVar41,dVar10);
                  }
                  else {
                    bVar18 = Profile::
                             check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar9,dVar41,dVar10,dVar8);
                  }
                }
LAB_001108eb:
                bVar31 = bVar31 & bVar18;
              }
              else if (CVar14 == Position) {
                if (CVar13 == UDUD) {
                  dVar41 = (inp->max_jerk)._M_elems[uVar39];
                  dVar8 = (this->new_phase_control)._M_elems[uVar39];
                  if (ABS(dVar41) == INFINITY) {
                    bVar18 = Profile::
                             check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar8,-dVar8,(inp->max_velocity)._M_elems[uVar39]
                                        ,(this->inp_min_velocity)._M_elems[uVar39],
                                        (inp->max_acceleration)._M_elems[uVar39],
                                        (this->inp_min_acceleration)._M_elems[uVar39]);
                  }
                  else {
                    bVar18 = Profile::
                             check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar8,(inp->max_velocity)._M_elems[uVar39],
                                        (this->inp_min_velocity)._M_elems[uVar39],
                                        (inp->max_acceleration)._M_elems[uVar39],
                                        (this->inp_min_acceleration)._M_elems[uVar39],dVar41);
                  }
                  goto LAB_001108eb;
                }
                if (CVar13 == UDDU) {
                  dVar41 = (inp->max_jerk)._M_elems[uVar39];
                  if (ABS(dVar41) == INFINITY) {
                    dVar41 = (inp->max_acceleration)._M_elems[uVar39];
                    dVar8 = (this->new_phase_control)._M_elems[uVar39];
                    if (ABS(dVar41) == INFINITY) {
                      bVar18 = Profile::
                               check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,tf,dVar8,(inp->max_velocity)._M_elems[uVar39],
                                          (this->inp_min_velocity)._M_elems[uVar39]);
                    }
                    else {
                      bVar18 = Profile::
                               check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,tf,dVar8,-dVar8,
                                          (inp->max_velocity)._M_elems[uVar39],
                                          (this->inp_min_velocity)._M_elems[uVar39],dVar41,
                                          (this->inp_min_acceleration)._M_elems[uVar39]);
                    }
                    goto LAB_001108eb;
                  }
                  bVar18 = Profile::
                           check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                     (this_00,tf,(this->new_phase_control)._M_elems[uVar39],
                                      (inp->max_velocity)._M_elems[uVar39],
                                      (this->inp_min_velocity)._M_elems[uVar39],
                                      (inp->max_acceleration)._M_elems[uVar39],
                                      (this->inp_min_acceleration)._M_elems[uVar39],dVar41);
                  bVar31 = bVar31 & bVar18;
                }
              }
LAB_001108f5:
              *(ReachedLimits *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x70U) =
                   pPVar30->limits;
            }
            lVar28 = lVar28 + 0x240;
          }
          if ((bVar31 != 0) &&
             (bVar18 = std::
                       all_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                                 (pSVar2,psVar1), bVar18)) {
            return Working;
          }
        }
      }
      pbVar35 = &(this->blocks)._M_elems[0].b.
                 super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                 super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
      lVar28 = 0;
      for (uVar39 = 0; uVar39 < *psVar1; uVar39 = uVar39 + 1) {
        if (((local_e90 == '\x01') && (uVar39 == local_e98._M_value)) ||
           (bVar31 = 1, pSVar2->_M_elems[uVar39] == None)) {
          bVar31 = (byte)local_e80;
        }
        if ((bVar31 & (inp->enabled)._M_elems[uVar39]) == 1) {
          paVar15 = (traj->profiles).
                    super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar41 = (traj->duration - *(double *)((long)&paVar15->_M_elems[0].brake + lVar28)) -
                   *(double *)((long)&paVar15->_M_elems[0].accel + lVar28);
          if (((pSVar2->_M_elems[uVar39] != TimeIfNecessary) ||
              (2.220446049250313e-16 <= ABS((inp->target_velocity)._M_elems[uVar39]))) ||
             (2.220446049250313e-16 <= ABS((inp->target_acceleration)._M_elems[uVar39]))) {
            pBVar33 = local_e88->_M_elems + uVar39;
            if (4.440892098500626e-16 <= ABS(dVar41 - *(double *)(pbVar35 + -0x4b0))) {
              if ((pbVar35[-600] != true) ||
                 (4.440892098500626e-16 <= ABS(dVar41 - *(double *)(pbVar35 + -0x4a0)))) {
                if ((*pbVar35 != true) ||
                   (4.440892098500626e-16 <= ABS(dVar41 - *(double *)(pbVar35 + -0x248)))) {
                  CVar14 = (this->inp_per_dof_control_interface)._M_elems[uVar39];
                  if (CVar14 == Velocity) {
                    dVar8 = (inp->max_jerk)._M_elems[uVar39];
                    if (ABS(dVar8) == INFINITY) {
                      ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                                ((VelocitySecondOrderStep2 *)&step1,dVar41,
                                 *(double *)((long)&paVar15->_M_elems[0].v + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x60U),
                                 (inp->max_acceleration)._M_elems[uVar39],
                                 (this->inp_min_acceleration)._M_elems[uVar39]);
                      cVar17 = ruckig::VelocitySecondOrderStep2::get_profile((Profile *)&step1);
                    }
                    else {
                      ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                                ((VelocityThirdOrderStep2 *)&step1,dVar41,
                                 *(double *)((long)&paVar15->_M_elems[0].v + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].a + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x60U),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x68U),
                                 (inp->max_acceleration)._M_elems[uVar39],
                                 (this->inp_min_acceleration)._M_elems[uVar39],dVar8);
                      cVar17 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)&step1);
                    }
                  }
                  else {
                    if (CVar14 != Position) {
                      return ErrorSynchronizationCalculation;
                    }
                    dVar8 = (inp->max_jerk)._M_elems[uVar39];
                    if (ABS(dVar8) == INFINITY) {
                      dVar8 = (inp->max_acceleration)._M_elems[uVar39];
                      if (ABS(dVar8) == INFINITY) {
                        ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                                  ((PositionFirstOrderStep2 *)&step1,dVar41,
                                   *(double *)((long)&paVar15->_M_elems[0].p + lVar28),
                                   *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x58U),
                                   (inp->max_velocity)._M_elems[uVar39],
                                   (this->inp_min_velocity)._M_elems[uVar39]);
                        cVar17 = ruckig::PositionFirstOrderStep2::get_profile((Profile *)&step1);
                      }
                      else {
                        ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                                  ((PositionSecondOrderStep2 *)&step1,dVar41,
                                   *(double *)((long)&paVar15->_M_elems[0].p + lVar28),
                                   *(double *)((long)&paVar15->_M_elems[0].v + lVar28),
                                   *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x58U),
                                   *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x60U),
                                   (inp->max_velocity)._M_elems[uVar39],
                                   (this->inp_min_velocity)._M_elems[uVar39],dVar8,
                                   (this->inp_min_acceleration)._M_elems[uVar39]);
                        cVar17 = ruckig::PositionSecondOrderStep2::get_profile((Profile *)&step1);
                      }
                    }
                    else {
                      ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                                ((PositionThirdOrderStep2 *)&step1,dVar41,
                                 *(double *)((long)&paVar15->_M_elems[0].p + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].v + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].a + lVar28),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x58U),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x60U),
                                 *(double *)((long)&paVar15->_M_elems[0].accel + lVar28 + 0x68U),
                                 (inp->max_velocity)._M_elems[uVar39],
                                 (this->inp_min_velocity)._M_elems[uVar39],
                                 (inp->max_acceleration)._M_elems[uVar39],
                                 (this->inp_min_acceleration)._M_elems[uVar39],dVar8);
                      cVar17 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)&step1);
                    }
                  }
                  if (cVar17 == '\0') {
                    return ErrorSynchronizationCalculation;
                  }
                  goto LAB_00110a49;
                }
                pBVar33 = (Block *)((long)&(pBVar33->b).
                                           super__Optional_base<ruckig::Block::Interval,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<ruckig::Block::Interval>.
                                           _M_payload + 0x10);
              }
              else {
                pBVar33 = (Block *)((long)&(pBVar33->a).
                                           super__Optional_base<ruckig::Block::Interval,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<ruckig::Block::Interval>.
                                           _M_payload + 0x10);
              }
            }
          }
          else {
            pBVar33 = (Block *)(pbVar35 + -0x6f0);
          }
          memcpy((void *)((long)&paVar15->_M_elems[0].t + lVar28),pBVar33,0x23c);
        }
LAB_00110a49:
        lVar28 = lVar28 + 0x240;
        pbVar35 = pbVar35 + 0x6f8;
      }
    }
  }
  return Working;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }